

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_FileExists_Test::TestBody(TApp_FileExists_Test *this)

{
  App *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  Option *pOVar6;
  long *plVar7;
  char *pcVar8;
  char *in_R9;
  long lVar9;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  string myfile;
  string filename;
  stat buffer;
  AssertHelper local_308;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  AssertHelper local_2f8;
  undefined1 local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_290;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  long local_220 [2];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 local_1f0 [184];
  ios_base local_138 [264];
  
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"TestNonFileNotUsed.txt","");
  iVar5 = stat(local_2d0._M_dataplus._M_p,(stat *)local_230);
  if (iVar5 == 0) {
    if ((local_220[1]._1_1_ & 0x40) != 0) {
      pcVar8 = "File is actually a directory: ";
      goto LAB_00127b32;
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
  }
  else {
    pcVar8 = "File does not exist: ";
LAB_00127b32:
    std::operator+(&local_2b0,pcVar8,&local_2d0);
  }
  paVar1 = &local_2b0.field_2;
  local_2f0[0] = local_2b0._M_string_length != 0;
  local_2f0._8_8_ = 0;
  uVar3 = local_2b0._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p);
    uVar3 = local_2f0._0_8_ & 1;
  }
  if (uVar3 == 0) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)local_2f0,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x303,(char *)local_230);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230);
    }
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_2b0._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Failed","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"--file","");
  pcVar8 = "";
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"","");
  this_00 = &(this->super_TApp).app;
  pOVar6 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_00,&local_250,&local_2b0,&local_270);
  local_290.super__Function_base._M_functor._8_8_ = 0;
  local_290.super__Function_base._M_functor._M_unused._M_object = CLI::ExistingFile;
  local_290._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_290.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&pOVar6->validators_,&local_290);
  if (local_290.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_290.super__Function_base._M_manager)
              ((_Any_data *)&local_290,(_Any_data *)&local_290,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_230 = (undefined1  [8])local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"--file","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,local_2d0._M_dataplus._M_p,
             local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_230,local_1f0);
  lVar9 = 0;
  do {
    if (local_200 + lVar9 != *(undefined1 **)((long)local_210 + lVar9)) {
      operator_delete(*(undefined1 **)((long)local_210 + lVar9));
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x40);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_230);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x309,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2f0,(Message *)local_230);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f0);
  if (((local_230 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
     (local_230 != (undefined1  [8])0x0)) {
    (**(code **)(*(long *)local_230 + 8))();
  }
  CLI::App::reset(this_00);
  std::ofstream::ofstream(local_230,local_2d0._M_dataplus._M_p,_S_out);
  plVar7 = (long *)std::ostream::put((char)local_230);
  bVar2 = *(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + _VTT[-3]) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  bVar4 = (bVar2 & 5) == 0;
  local_2f0[0] = bVar4;
  local_2f0._8_8_ = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)local_2f0,(AssertionResult *)"ok","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x30e,(char *)local_230);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230);
    }
    if (((CONCAT71(local_308.data_._1_7_,local_308.data_._0_1_) != 0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((long *)CONCAT71(local_308.data_._1_7_,local_308.data_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_308.data_._1_7_,local_308.data_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_230,"myfile","filename",&local_2d0,&local_2b0);
  if (local_230[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2f0);
    if (local_228.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x310,pcVar8);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((((AssertHelperData *)local_2f0._0_8_ != (AssertHelperData *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((AssertHelperData *)local_2f0._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_2f0._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  remove(local_2d0._M_dataplus._M_p);
  iVar5 = stat(local_2d0._M_dataplus._M_p,(stat *)local_230);
  if (iVar5 == 0) {
    if ((local_220[1]._1_1_ & 0x40) != 0) {
      pcVar8 = "File is actually a directory: ";
      goto LAB_00128099;
    }
    local_2f0._0_8_ = local_2f0 + 0x10;
    local_2f0._8_8_ = 0;
    local_2f0[0x10] = '\0';
  }
  else {
    pcVar8 = "File does not exist: ";
LAB_00128099:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   pcVar8,&local_2d0);
  }
  local_308.data_._0_1_ = (internal)(local_2f0._8_8_ != 0);
  local_300.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((AssertHelperData *)local_2f0._0_8_ == (AssertHelperData *)(local_2f0 + 0x10)) {
    if (local_2f0._8_8_ != 0) goto LAB_00128186;
  }
  else {
    operator_delete((void *)local_2f0._0_8_);
    if (((byte)local_308.data_._0_1_ & 1) != 0) goto LAB_00128186;
  }
  testing::Message::Message((Message *)local_2f0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_230,(internal *)&local_308,
             (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_2f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x313,(char *)local_230);
  testing::internal::AssertHelper::operator=(&local_2f8,(Message *)local_2f0);
  testing::internal::AssertHelper::~AssertHelper(&local_2f8);
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230);
  }
  if ((((AssertHelperData *)local_2f0._0_8_ != (AssertHelperData *)0x0) &&
      (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
     ((AssertHelperData *)local_2f0._0_8_ != (AssertHelperData *)0x0)) {
    (**(code **)(*(long *)local_2f0._0_8_ + 8))();
  }
LAB_00128186:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_300,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, FileExists) {
    std::string myfile{"TestNonFileNotUsed.txt"};
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());

    std::string filename = "Failed";
    app.add_option("--file", filename)->check(CLI::ExistingFile);
    args = {"--file", myfile};

    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();

    bool ok = static_cast<bool>(std::ofstream(myfile.c_str()).put('a')); // create file
    EXPECT_TRUE(ok);
    run();
    EXPECT_EQ(myfile, filename);

    std::remove(myfile.c_str());
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());
}